

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O3

void bfR4(float *ioptr,long M,long NDiffU)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  long lVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  pfVar18 = ioptr + NDiffU * 2;
  uVar9 = *(ulong *)ioptr;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar9;
  pfVar19 = pfVar18 + NDiffU * 2;
  uVar10 = *(ulong *)pfVar18;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar10;
  uVar11 = *(ulong *)pfVar19;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar11;
  uVar12 = *(ulong *)(pfVar19 + NDiffU * 2);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar12;
  auVar21._0_4_ = (float)uVar10 + (float)uVar9;
  auVar21._4_4_ = (float)(uVar10 >> 0x20) + (float)(uVar9 >> 0x20);
  auVar21._8_8_ = 0;
  auVar20 = vsubps_avx(auVar20,auVar23);
  auVar22._0_4_ = (float)uVar12 + (float)uVar11;
  auVar22._4_4_ = (float)(uVar12 >> 0x20) + (float)(uVar11 >> 0x20);
  auVar22._8_8_ = 0;
  auVar23 = vsubps_avx(auVar24,auVar25);
  auVar22 = vmovlhps_avx(auVar21,auVar22);
  auVar20 = vmovlhps_avx(auVar23,auVar20);
  lVar16 = ((ulong)(1L << (M & 0x3fU)) >> 2) / (ulong)NDiffU - 1;
  if (lVar16 == 0) {
    pfVar17 = pfVar19 + NDiffU * 2;
  }
  else {
    auVar22 = vshufps_avx(auVar22,auVar20,0xbb);
    auVar20 = vmovshdup_avx(auVar23);
    do {
      auVar27 = vshufps_avx(auVar22,auVar22,0xff);
      auVar26 = vshufpd_avx(auVar22,auVar22,1);
      auVar24 = vmovshdup_avx(auVar21);
      fVar1 = ioptr[NDiffU * 6 + 3];
      fVar2 = ioptr[NDiffU * 2 + 3];
      fVar3 = ioptr[NDiffU * 6 + 2];
      fVar4 = ioptr[2];
      fVar5 = ioptr[NDiffU * 2 + 2];
      fVar6 = ioptr[3];
      lVar16 = lVar16 + -1;
      auVar25 = vmovshdup_avx(auVar22);
      fVar7 = ioptr[NDiffU * 4 + 3];
      fVar8 = ioptr[NDiffU * 4 + 2];
      ioptr[NDiffU * 6] = auVar27._0_4_ - auVar20._0_4_;
      *ioptr = auVar25._0_4_ + auVar21._0_4_;
      ioptr[NDiffU * 6 + 1] = auVar26._0_4_ + auVar23._0_4_;
      ioptr[1] = auVar24._0_4_ + auVar22._0_4_;
      ioptr[NDiffU * 2] = auVar27._0_4_ + auVar20._0_4_;
      ioptr[NDiffU * 4] = auVar21._0_4_ - auVar25._0_4_;
      ioptr[NDiffU * 2 + 1] = auVar26._0_4_ - auVar23._0_4_;
      ioptr[NDiffU * 4 + 1] = auVar24._0_4_ - auVar22._0_4_;
      uVar9 = *(ulong *)(ioptr + NDiffU * 8);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar9;
      auVar20 = vsubss_avx512f(ZEXT416((uint)fVar4),ZEXT416((uint)fVar2));
      auVar21 = vsubss_avx512f(ZEXT416((uint)fVar6),ZEXT416((uint)fVar5));
      auVar22 = vaddss_avx512f(ZEXT416((uint)fVar6),ZEXT416((uint)fVar5));
      uVar10 = *(ulong *)(ioptr + NDiffU * 0xc);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar10;
      auVar23 = vsubss_avx512f(ZEXT416((uint)fVar8),ZEXT416((uint)fVar1));
      auVar24 = vaddss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar8));
      auVar25 = vaddss_avx512f(ZEXT416((uint)fVar4),ZEXT416((uint)fVar2));
      uVar11 = *(ulong *)(ioptr + NDiffU * 10);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar11;
      fVar2 = (fVar3 + fVar7) * 0.70710677;
      fVar4 = auVar23._0_4_ * 0.70710677;
      fVar1 = (auVar20._0_4_ - fVar4) + fVar2;
      fVar5 = auVar24._0_4_ * 0.70710677;
      fVar3 = (fVar7 - fVar3) * -0.70710677;
      fVar4 = auVar22._0_4_ - (fVar4 + fVar2);
      auVar24 = SUB6416(ZEXT464(0x40000000),0);
      auVar20 = vfmsub213ss_fma(auVar20,auVar24,ZEXT416((uint)fVar1));
      auVar22 = vfmsub213ss_fma(auVar22,auVar24,ZEXT416((uint)fVar4));
      fVar2 = (auVar25._0_4_ - fVar5) + fVar3;
      fVar3 = auVar21._0_4_ + fVar5 + fVar3;
      uVar12 = *(ulong *)(ioptr + NDiffU * 0xe);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar12;
      auVar23 = vfmsub213ss_fma(auVar25,auVar24,ZEXT416((uint)fVar2));
      auVar24 = vfmsub213ss_fma(auVar21,auVar24,ZEXT416((uint)fVar3));
      ioptr[NDiffU * 4 + 2] = fVar2;
      ioptr[NDiffU * 2 + 2] = fVar1;
      ioptr[NDiffU * 4 + 3] = fVar3;
      ioptr[NDiffU * 2 + 3] = fVar4;
      ioptr[NDiffU * 6 + 2] = auVar20._0_4_;
      auVar21._0_4_ = (float)uVar11 + (float)uVar9;
      auVar21._4_4_ = (float)(uVar11 >> 0x20) + (float)(uVar9 >> 0x20);
      auVar21._8_8_ = 0;
      ioptr[2] = auVar23._0_4_;
      ioptr[NDiffU * 6 + 3] = auVar22._0_4_;
      ioptr[3] = auVar24._0_4_;
      auVar24 = vsubps_avx(auVar28,auVar30);
      ioptr = ioptr + NDiffU * 8;
      auVar23 = vsubps_avx(auVar29,auVar26);
      auVar27._0_4_ = (float)uVar10 + (float)uVar12;
      auVar27._4_4_ = (float)(uVar10 >> 0x20) + (float)(uVar12 >> 0x20);
      auVar27._8_8_ = 0;
      auVar20 = vmovshdup_avx(auVar23);
      auVar22 = vshufps_avx(auVar27,auVar24,0x11);
    } while (lVar16 != 0);
    auVar20 = vmovlhps_avx(auVar23,auVar24);
    auVar22 = vmovlhps_avx(auVar21,auVar27);
    pfVar19 = ioptr + NDiffU * 4;
    pfVar18 = ioptr + NDiffU * 2;
    pfVar17 = ioptr + NDiffU * 6;
  }
  auVar23 = vmovshdup_avx(auVar20);
  auVar24 = vshufpd_avx(auVar20,auVar20,1);
  auVar26 = vshufps_avx(auVar20,auVar20,0xff);
  auVar21 = vmovshdup_avx(auVar22);
  auVar27 = vshufps_avx(auVar22,auVar22,0xff);
  fVar1 = pfVar17[2];
  fVar2 = pfVar17[3];
  fVar3 = pfVar18[2];
  fVar4 = pfVar18[3];
  fVar5 = ioptr[2];
  fVar6 = ioptr[3];
  auVar25 = vshufpd_avx(auVar22,auVar22,1);
  fVar7 = pfVar19[3];
  fVar8 = pfVar19[2];
  *pfVar17 = auVar24._0_4_ - auVar23._0_4_;
  *ioptr = auVar25._0_4_ + auVar22._0_4_;
  pfVar17[1] = auVar26._0_4_ + auVar20._0_4_;
  ioptr[1] = auVar27._0_4_ + auVar21._0_4_;
  *pfVar18 = auVar24._0_4_ + auVar23._0_4_;
  *pfVar19 = auVar22._0_4_ - auVar25._0_4_;
  pfVar18[1] = auVar26._0_4_ - auVar20._0_4_;
  pfVar19[1] = auVar21._0_4_ - auVar27._0_4_;
  fVar13 = fVar5 + fVar4;
  fVar15 = fVar6 - fVar3;
  fVar5 = fVar5 - fVar4;
  fVar4 = (fVar7 - fVar1) * -0.70710677;
  fVar6 = fVar6 + fVar3;
  fVar14 = (fVar8 - fVar2) * 0.70710677;
  fVar3 = (fVar1 + fVar7) * 0.70710677;
  fVar2 = (fVar2 + fVar8) * 0.70710677;
  fVar7 = fVar6 - (fVar14 + fVar3);
  fVar1 = (fVar13 - fVar2) + fVar4;
  fVar3 = (fVar5 - fVar14) + fVar3;
  fVar4 = fVar15 + fVar2 + fVar4;
  auVar21 = SUB6416(ZEXT464(0x40000000),0);
  auVar20 = vfmsub213ss_fma(ZEXT416((uint)fVar5),auVar21,ZEXT416((uint)fVar3));
  auVar22 = vfmsub213ss_fma(ZEXT416((uint)fVar6),auVar21,ZEXT416((uint)fVar7));
  auVar23 = vfmsub213ss_fma(ZEXT416((uint)fVar13),auVar21,ZEXT416((uint)fVar1));
  auVar21 = vfmsub213ss_fma(auVar21,ZEXT416((uint)fVar15),ZEXT416((uint)fVar4));
  pfVar19[2] = fVar1;
  pfVar18[2] = fVar3;
  pfVar19[3] = fVar4;
  pfVar18[3] = fVar7;
  pfVar17[2] = auVar20._0_4_;
  ioptr[2] = auVar23._0_4_;
  pfVar17[3] = auVar22._0_4_;
  ioptr[3] = auVar21._0_4_;
  return;
}

Assistant:

static inline void bfR4(float *ioptr, long M, long NDiffU) {
/*** 1 radix 4 stage ***/
unsigned long	pos;
unsigned long	posi;
unsigned long	pinc;
unsigned long	pnext;
unsigned long	pnexti;
unsigned long 	NSameU;
unsigned long 	SameUCnt;

float	*pstrt;
float 	*p0r, *p1r, *p2r, *p3r;

float w1r = 1.0/MYROOT2; /* cos(pi/4)	*/
float f0r, f0i, f1r, f1i, f2r, f2i, f3r, f3i;
float f4r, f4i, f5r, f5i, f6r, f6i, f7r, f7i;
float t1r, t1i;
const float Two = 2.0;

pinc = NDiffU * 2;		// 2 floats per complex
pnext =  pinc * 4;
pnexti =  pnext + 1;
pos = 2;
posi = pos+1;
NSameU = POW2(M) / 4 /NDiffU;	// 4 pts per butterfly
pstrt = ioptr;
p0r = pstrt;
p1r = pstrt+pinc;
p2r = p1r+pinc;
p3r = p2r+pinc;

		/* Butterflys		*/
		/*
		f0	-	-	f0	-	-	f4
		f1	-  1 -	f5	-	-	f5
		f2	-	-	f6	-  1 -	f6
		f3	-  1 -	f3	- -i -	f7
		*/
		/* Butterflys		*/
		/*
		f0	-	-	f4	-	-	f4
		f1	- -i -	t1	-	-	f5
		f2	-	-	f2	- w1 -	f6
		f3	- -i -	f7	- iw1-	f7
		*/

f0r = *p0r;
f1r = *p1r;
f2r = *p2r;
f3r = *p3r;
f0i = *(p0r + 1);
f1i = *(p1r + 1);
f2i = *(p2r + 1);
f3i = *(p3r + 1);

f5r = f0r - f1r;
f5i = f0i - f1i;
f0r = f0r + f1r;
f0i = f0i + f1i;

f6r = f2r + f3r;
f6i = f2i + f3i;
f3r = f2r - f3r;
f3i = f2i - f3i;

for (SameUCnt = NSameU-1; SameUCnt > 0 ; SameUCnt--){

	f7r = f5r - f3i;
	f7i = f5i + f3r;
	f5r = f5r + f3i;
	f5i = f5i - f3r;

	f4r = f0r + f6r;
	f4i = f0i + f6i;
	f6r = f0r - f6r;
	f6i = f0i - f6i;

	f2r = *(p2r + pos);
	f2i = *(p2r + posi);
	f1r = *(p1r + pos);
	f1i = *(p1r + posi);
	f3i = *(p3r + posi);
	f0r = *(p0r + pos);
	f3r = *(p3r + pos);
	f0i = *(p0r + posi);

	*p3r = f7r;
	*p0r = f4r;
	*(p3r + 1) = f7i;
	*(p0r + 1) = f4i;
	*p1r = f5r;
	*p2r = f6r;
	*(p1r + 1) = f5i;
	*(p2r + 1) = f6i;

	f7r = f2r - f3i;
	f7i = f2i + f3r;
	f2r = f2r + f3i;
	f2i = f2i - f3r;

	f4r = f0r + f1i;
	f4i = f0i - f1r;
	t1r = f0r - f1i;
	t1i = f0i + f1r;

	f5r = t1r - f7r * w1r + f7i * w1r;
	f5i = t1i - f7r * w1r - f7i * w1r;
	f7r = t1r * Two - f5r;
	f7i = t1i * Two - f5i;

	f6r = f4r - f2r * w1r - f2i * w1r;
	f6i = f4i + f2r * w1r - f2i * w1r;
	f4r = f4r * Two - f6r;
	f4i = f4i * Two - f6i;

	f3r = *(p3r + pnext);
	f0r = *(p0r + pnext);
	f3i = *(p3r + pnexti);
	f0i = *(p0r + pnexti);
	f2r = *(p2r + pnext);
	f2i = *(p2r + pnexti);
	f1r = *(p1r + pnext);
	f1i = *(p1r + pnexti);

	*(p2r + pos) = f6r;
	*(p1r + pos) = f5r;
	*(p2r + posi) = f6i;
	*(p1r + posi) = f5i;
	*(p3r + pos) = f7r;
	*(p0r + pos) = f4r;
	*(p3r + posi) = f7i;
	*(p0r + posi) = f4i;

	f6r = f2r + f3r;
	f6i = f2i + f3i;
	f3r = f2r - f3r;
	f3i = f2i - f3i;

	f5r = f0r - f1r;
	f5i = f0i - f1i;
	f0r = f0r + f1r;
	f0i = f0i + f1i;

	p3r += pnext;
	p0r += pnext;
	p1r += pnext;
	p2r += pnext;

}
f7r = f5r - f3i;
f7i = f5i + f3r;
f5r = f5r + f3i;
f5i = f5i - f3r;

f4r = f0r + f6r;
f4i = f0i + f6i;
f6r = f0r - f6r;
f6i = f0i - f6i;

f2r = *(p2r + pos);
f2i = *(p2r + posi);
f1r = *(p1r + pos);
f1i = *(p1r + posi);
f3i = *(p3r + posi);
f0r = *(p0r + pos);
f3r = *(p3r + pos);
f0i = *(p0r + posi);

*p3r = f7r;
*p0r = f4r;
*(p3r + 1) = f7i;
*(p0r + 1) = f4i;
*p1r = f5r;
*p2r = f6r;
*(p1r + 1) = f5i;
*(p2r + 1) = f6i;

f7r = f2r - f3i;
f7i = f2i + f3r;
f2r = f2r + f3i;
f2i = f2i - f3r;

f4r = f0r + f1i;
f4i = f0i - f1r;
t1r = f0r - f1i;
t1i = f0i + f1r;

f5r = t1r - f7r * w1r + f7i * w1r;
f5i = t1i - f7r * w1r - f7i * w1r;
f7r = t1r * Two - f5r;
f7i = t1i * Two - f5i;

f6r = f4r - f2r * w1r - f2i * w1r;
f6i = f4i + f2r * w1r - f2i * w1r;
f4r = f4r * Two - f6r;
f4i = f4i * Two - f6i;

*(p2r + pos) = f6r;
*(p1r + pos) = f5r;
*(p2r + posi) = f6i;
*(p1r + posi) = f5i;
*(p3r + pos) = f7r;
*(p0r + pos) = f4r;
*(p3r + posi) = f7i;
*(p0r + posi) = f4i;

}